

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  uint uVar1;
  char *__s2;
  int iVar2;
  void **ppvVar3;
  lws_protocols *plVar4;
  void *pvVar5;
  ulong uVar6;
  
  if (vhost->protocol_vh_privs == (void **)0x0) {
    ppvVar3 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
    vhost->protocol_vh_privs = ppvVar3;
    if (ppvVar3 != (void **)0x0) goto LAB_00113786;
LAB_001137f9:
    pvVar5 = (void *)0x0;
  }
  else {
LAB_00113786:
    uVar1 = vhost->count_protocols;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    else {
      plVar4 = vhost->protocols + -1;
      uVar6 = 0;
      do {
        plVar4 = plVar4 + 1;
        if (plVar4 == prot) goto LAB_001137b9;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      uVar6 = (ulong)uVar1;
    }
LAB_001137b9:
    if ((uint)uVar6 == uVar1) {
      if ((int)uVar1 < 1) {
        uVar6 = 0;
      }
      else {
        plVar4 = vhost->protocols;
        __s2 = prot->name;
        uVar6 = 0;
        do {
          iVar2 = strcmp(plVar4->name,__s2);
          if (iVar2 == 0) goto LAB_001137f4;
          uVar6 = uVar6 + 1;
          plVar4 = plVar4 + 1;
        } while (uVar1 != uVar6);
        uVar6 = (ulong)uVar1;
      }
LAB_001137f4:
      if ((uint)uVar6 == uVar1) goto LAB_001137f9;
    }
    pvVar5 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[uVar6 & 0xffffffff] = pvVar5;
    pvVar5 = vhost->protocol_vh_privs[uVar6 & 0xffffffff];
  }
  return pvVar5;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");
		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols &&
		       strcmp(vhost->protocols[n].name, prot->name))
			n++;

		if (n == vhost->count_protocols)
			return NULL;
	}

	vhost->protocol_vh_privs[n] = lws_zalloc(size, "vh priv");
	return vhost->protocol_vh_privs[n];
}